

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O0

bool __thiscall crnd::crn_unpacker::decode_alpha_selectors_etcs(crn_unpacker *this)

{
  uint8 *puVar1;
  byte bVar2;
  uint uVar3;
  uint buf_size;
  uint32 uVar4;
  int iVar5;
  unsigned_short *puVar6;
  ulong uVar7;
  uint local_b4;
  byte local_65;
  uint local_64;
  uint8 bit_offset;
  uint8 byte_offset;
  uint8 d;
  uint8 s;
  uint p;
  uint s_group;
  uint i;
  uint8 *data;
  uint8 s_linear [8];
  undefined1 local_38 [8];
  static_huffman_data_model dm;
  crn_unpacker *this_local;
  
  puVar1 = this->m_pData;
  dm.m_pDecode_tables = (decoder_tables *)this;
  uVar3 = crn_packed_uint::operator_cast_to_unsigned_int
                    ((crn_packed_uint *)&this->m_pHeader->m_alpha_selectors);
  buf_size = crn_packed_uint::operator_cast_to_unsigned_int
                       ((crn_packed_uint *)&(this->m_pHeader->m_alpha_selectors).m_size);
  symbol_codec::start_decoding(&this->m_codec,puVar1 + uVar3,buf_size);
  static_huffman_data_model::static_huffman_data_model((static_huffman_data_model *)local_38);
  symbol_codec::decode_receive_static_data_model
            (&this->m_codec,(static_huffman_data_model *)local_38);
  uVar3 = crn_packed_uint::operator_cast_to_unsigned_int
                    ((crn_packed_uint *)&(this->m_pHeader->m_alpha_selectors).m_num);
  vector<unsigned_short>::resize(&this->m_alpha_selectors,uVar3 * 3);
  data = (uint8 *)0x0;
  puVar6 = vector<unsigned_short>::begin(&this->m_alpha_selectors);
  p = 0;
  while( true ) {
    uVar4 = vector<unsigned_short>::size(&this->m_alpha_selectors);
    if (uVar4 << 1 <= p) break;
    _bit_offset = 0;
    for (local_64 = 0; local_64 < 0x10; local_64 = local_64 + 1) {
      if ((local_64 & 1) == 0) {
        uVar4 = symbol_codec::decode(&this->m_codec,(static_huffman_data_model *)local_38);
        bVar2 = s_linear[(ulong)(local_64 >> 1) - 8];
        s_linear[(ulong)(local_64 >> 1) - 8] = (uint8)(bVar2 ^ uVar4);
        local_b4 = (bVar2 ^ uVar4) & 0xff;
      }
      else {
        local_b4 = _bit_offset >> 3;
      }
      _bit_offset = local_b4;
      local_65 = (byte)local_b4 & 7;
      if (local_65 < 4) {
        local_65 = 3 - local_65;
      }
      bVar2 = ((byte)local_64 + 1) * '\x03' + (((byte)local_64 & 3) - (char)(local_64 >> 2)) * '\t';
      iVar5 = (int)(uint)bVar2 >> 3;
      bVar2 = bVar2 & 7;
      uVar7 = (ulong)(p + iVar5);
      *(byte *)((long)puVar6 + uVar7) =
           *(byte *)((long)puVar6 + uVar7) | local_65 << (8 - bVar2 & 0x1f);
      if (bVar2 < 3) {
        uVar7 = (ulong)((p + iVar5) - 1);
        *(byte *)((long)puVar6 + uVar7) =
             *(byte *)((long)puVar6 + uVar7) | (byte)((int)(uint)local_65 >> bVar2);
      }
    }
    p = p + 6;
  }
  symbol_codec::stop_decoding(&this->m_codec);
  static_huffman_data_model::~static_huffman_data_model((static_huffman_data_model *)local_38);
  return true;
}

Assistant:

bool decode_alpha_selectors_etcs()
        {
            m_codec.start_decoding(m_pData + m_pHeader->m_alpha_selectors.m_ofs, m_pHeader->m_alpha_selectors.m_size);
            static_huffman_data_model dm;
            m_codec.decode_receive_static_data_model(dm);
            m_alpha_selectors.resize(m_pHeader->m_alpha_selectors.m_num * 3);
            uint8 s_linear[8] = {};
            uint8* data = (uint8*)m_alpha_selectors.begin();
            for (uint i = 0; i < (m_alpha_selectors.size() << 1); i += 6)
            {
                for (uint s_group = 0, p = 0; p < 16; p++)
                {
                    s_group = p & 1 ? s_group >> 3 : s_linear[p >> 1] ^= m_codec.decode(dm);
                    uint8 s = s_group & 7;
                    if (s <= 3)
                        s = 3 - s;
                    uint8 d = 3 * (p + 1) + 9 * ((p & 3) - (p >> 2));
                    uint8 byte_offset = d >> 3;
                    uint8 bit_offset = d & 7;
                    data[i + byte_offset] |= s << (8 - bit_offset);
                    if (bit_offset < 3)
                        data[i + byte_offset - 1] |= s >> bit_offset;
                }
            }
            m_codec.stop_decoding();
            return true;
        }